

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O1

void h262_print_macroblock(h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,int addr)

{
  uint32_t uVar1;
  uint extraout_EDX;
  char **ppcVar2;
  h262_macroblock *phVar3;
  ulong uVar4;
  int32_t (*paiVar5) [64];
  char *__format;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint32_t (*paauVar9) [2] [2];
  uint32_t (*paauVar10) [2] [2];
  bool bVar11;
  uint local_64;
  
  printf("\tMacroblock %d: (%d, %d)\n",(ulong)(uint)addr,
         (ulong)(uint)addr % (ulong)picparm->pic_width_in_mbs);
  printf("\t\tmacroblock_flags =");
  if (mb->macroblock_skipped != 0) {
    printf(" SKIP");
  }
  if (mb->macroblock_quant != 0) {
    printf(" QUANT");
  }
  if (mb->macroblock_motion_forward != 0) {
    printf(" FWD");
  }
  if (mb->macroblock_motion_backward != 0) {
    printf(" BWD");
  }
  if (mb->macroblock_pattern != 0) {
    printf(" PATTERN");
  }
  if (mb->macroblock_intra != 0) {
    printf(" INTRA");
  }
  putchar(10);
  if (mb->macroblock_intra == 0) {
    bVar11 = picparm->picture_structure != 3;
    ppcVar2 = h262_print_macroblock::fipms;
    if (!bVar11) {
      ppcVar2 = h262_print_macroblock::frpms;
    }
    __format = "\t\tfield_motion_type = %d [%s]\n";
    if (!bVar11) {
      __format = "\t\tframe_motion_type = %d [%s]\n";
    }
    printf(__format,(ulong)*(uint32_t *)
                            ((long)(mb->motion_vertical_field_select + -2) + (ulong)bVar11 * 4),
           ppcVar2[*(uint32_t *)((long)(mb->motion_vertical_field_select + -2) + (ulong)bVar11 * 4)]
          );
  }
  if ((mb->macroblock_intra != 0) || (mb->macroblock_pattern != 0)) {
    printf("\t\tdct_type = %d\n",(ulong)mb->dct_type);
  }
  printf("\t\tquantiser_scale_code = %d\n",(ulong)mb->quantiser_scale_code);
  if ((mb->macroblock_intra != 0) || (mb->macroblock_skipped != 0)) goto LAB_00105cd7;
  if (picparm->picture_structure == 3) {
    uVar1 = mb->frame_motion_type;
    if (uVar1 == 1) {
      uVar1 = 2;
LAB_00105bb4:
      local_64 = 0;
    }
    else {
      if (uVar1 == 3) {
LAB_00105b94:
        uVar1 = 1;
        bVar11 = true;
        phVar3 = (h262_macroblock *)0x0;
        local_64 = 1;
        goto LAB_00105bc0;
      }
      if (uVar1 != 2) goto LAB_00105ba5;
      uVar1 = 1;
      local_64 = 1;
    }
    bVar11 = true;
    phVar3 = (h262_macroblock *)0x1;
  }
  else {
    uVar1 = mb->field_motion_type;
    if (uVar1 - 1 < 2) goto LAB_00105bb4;
    if (uVar1 == 3) goto LAB_00105b94;
LAB_00105ba5:
    bVar11 = false;
    uVar1 = 0;
    phVar3 = mb;
    local_64 = extraout_EDX;
  }
LAB_00105bc0:
  if (bVar11) {
    paauVar9 = mb->motion_residual;
    uVar8 = 0;
    do {
      uVar4 = 0;
      paauVar10 = paauVar9;
      do {
        if ((uVar4 & 1) == 0) {
          if (mb->macroblock_motion_forward != 0) {
            if (uVar4 == 1) goto LAB_00105c1f;
            goto LAB_00105c2a;
          }
        }
        else {
LAB_00105c1f:
          if (mb->macroblock_motion_backward != 0) {
LAB_00105c2a:
            if ((local_64 & 1) == 0) {
              printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n",uVar8 & 0xffffffff,
                     uVar4 & 0xffffffff,(ulong)mb->motion_vertical_field_select[uVar8][uVar4]);
            }
            uVar6 = 0;
            do {
              printf("\t\tmotion_code[%d][%d][%d] = %d\n",uVar8 & 0xffffffff,uVar4 & 0xffffffff,
                     uVar6 & 0xffffffff,(ulong)paauVar10[-2][0][uVar6]);
              printf("\t\tmotion_residual[%d][%d][%d] = %d\n",uVar8 & 0xffffffff,uVar4 & 0xffffffff,
                     uVar6 & 0xffffffff,(ulong)(*paauVar10)[0][uVar6]);
              if (((ulong)phVar3 & 1) == 0) {
                printf("\t\tdmvector[%d] = %d\n",uVar6 & 0xffffffff,(ulong)mb->dmvector[uVar6]);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 == 1);
          }
        }
        paauVar10 = (uint32_t (*) [2] [2])(*paauVar10 + 1);
        bVar11 = uVar4 == 0;
        uVar4 = uVar4 + 1;
      } while (bVar11);
      uVar8 = uVar8 + 1;
      paauVar9 = paauVar9 + 1;
    } while (uVar8 != uVar1 + (uVar1 == 0));
  }
LAB_00105cd7:
  printf("\t\tcoded_block_pattern = 0x%x\n",(ulong)mb->coded_block_pattern);
  paiVar5 = mb->block;
  uVar8 = 0;
  do {
    printf("\t\tBlock %d:",uVar8 & 0xffffffff);
    lVar7 = 0;
    do {
      printf(" %d",(ulong)(uint)(*paiVar5)[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    putchar(10);
    uVar8 = uVar8 + 1;
    paiVar5 = paiVar5 + 1;
  } while ((long)uVar8 < (long)h262_macroblock::block_count[seqparm->chroma_format]);
  return;
}

Assistant:

void h262_print_macroblock(struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int addr) {
	int i;
	static const int block_count[4] = { 4, 6, 8, 12 };
	static const char *const frpms[] = { "???", "field", "frame", "dual-prime" };
	static const char *const fipms[] = { "???", "field", "16x8", "dual-prime" };
	printf("\tMacroblock %d: (%d, %d)\n", addr, addr % picparm->pic_width_in_mbs, addr / picparm->pic_width_in_mbs);
	printf("\t\tmacroblock_flags =");
	if (mb->macroblock_skipped)
		printf(" SKIP");
	if (mb->macroblock_quant)
		printf(" QUANT");
	if (mb->macroblock_motion_forward)
		printf(" FWD");
	if (mb->macroblock_motion_backward)
		printf(" BWD");
	if (mb->macroblock_pattern)
		printf(" PATTERN");
	if (mb->macroblock_intra)
		printf(" INTRA");
	printf("\n");
	if (!mb->macroblock_intra) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			printf("\t\tframe_motion_type = %d [%s]\n", mb->frame_motion_type, frpms[mb->frame_motion_type]);
		} else {
			printf("\t\tfield_motion_type = %d [%s]\n", mb->field_motion_type, fipms[mb->field_motion_type]);
		}
	}
	if (mb->macroblock_intra || mb->macroblock_pattern)
		printf("\t\tdct_type = %d\n", mb->dct_type);
	printf("\t\tquantiser_scale_code = %d\n", mb->quantiser_scale_code);
	if (!mb->macroblock_intra && !mb->macroblock_skipped) {
		int mvc, mfs, dmv;
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			switch (mb->frame_motion_type) {
				case H262_FRAME_MOTION_FIELD:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_FRAME:
					mvc = 1;
					mfs = 0;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		} else {
			switch (mb->field_motion_type) {
				case H262_FIELD_MOTION_FIELD:
					mvc = 1;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_16X8:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		}
		int r, s, t;
		for (r = 0; r < mvc; r++) {
			for (s = 0; s < 2; s++) {
				if (s == 0 && !mb->macroblock_motion_forward)
					continue;
				if (s == 1 && !mb->macroblock_motion_backward)
					continue;
				if (mfs)
					printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n", r, s, mb->motion_vertical_field_select[r][s]);
				for (t = 0; t < 2; t++) {
					printf("\t\tmotion_code[%d][%d][%d] = %d\n", r, s, t, mb->motion_code[r][s][t]);
					printf("\t\tmotion_residual[%d][%d][%d] = %d\n", r, s, t, mb->motion_residual[r][s][t]);
					if (dmv)
						printf("\t\tdmvector[%d] = %d\n", t, mb->dmvector[t]);
				}
			}
		}
	}
	printf("\t\tcoded_block_pattern = 0x%x\n", mb->coded_block_pattern);
	for (i = 0; i < block_count[seqparm->chroma_format]; i++) {
		printf("\t\tBlock %d:", i);
		int j;
		for (j = 0; j < 64; j++)
			printf(" %d", mb->block[i][j]);
		printf("\n");
	}
}